

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.h
# Opt level: O2

void __thiscall
BvhNode::BvhNode(BvhNode *this,vector<Hitable_*,_std::allocator<Hitable_*>_> *hitable_vec,double t0,
                double t1)

{
  pointer ppHVar1;
  Hitable **list;
  size_t i;
  long lVar2;
  long lVar3;
  
  (this->super_Hitable)._vptr_Hitable = (_func_int **)&PTR_Hit_00121c60;
  ppHVar1 = (hitable_vec->super__Vector_base<Hitable_*,_std::allocator<Hitable_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar3 = (long)(hitable_vec->super__Vector_base<Hitable_*,_std::allocator<Hitable_*>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)ppHVar1 >> 3;
  list = (Hitable **)operator_new__(-(ulong)(lVar3 + 1U >> 0x3d != 0) | lVar3 * 8 + 8U);
  for (lVar2 = 0; lVar3 != lVar2; lVar2 = lVar2 + 1) {
    list[lVar2] = ppHVar1[lVar2];
  }
  Build(this,list,(int)lVar3,t0,t1);
  return;
}

Assistant:

BvhNode::BvhNode(const std::vector<Hitable*> hitable_vec, double t0, double t1) {
  auto n = hitable_vec.size();
  Hitable** list = new Hitable*[n + 1];
  for (size_t i = 0; i < n; i++) {
    list[i] = hitable_vec[i];
  }
  Build(list, n, t0, t1);
}